

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libskiwi.cpp
# Opt level: O0

fptr skiwi::anon_unknown_1::compile(uint64_t *size,string *input,environment_map *env,repl_data *rd)

{
  fptr p_Var1;
  logic_error e_1;
  runtime_error e_2;
  fptr f;
  first_pass_data d;
  logic_error e;
  Program local_1b8;
  token *local_158;
  __normal_iterator<skiwi::token_*,_std::vector<skiwi::token,_std::allocator<skiwi::token>_>_>
  local_150;
  undefined1 local_148 [8];
  vector<skiwi::token,_std::allocator<skiwi::token>_> tokens;
  repl_data rd_copy;
  shared_ptr<skiwi::environment<skiwi::environment_entry>_> env_copy;
  undefined1 local_c0 [8];
  Program prog;
  asmcode code;
  repl_data *rd_local;
  environment_map *env_local;
  string *input_local;
  uint64_t *size_local;
  
  assembler::asmcode::asmcode((asmcode *)&prog.quasiquotes_converted);
  Program::Program((Program *)local_c0);
  make_deep_copy<skiwi::environment_entry>((skiwi *)&rd_copy.global_index,env);
  make_deep_copy((repl_data *)
                 &tokens.super__Vector_base<skiwi::token,_std::allocator<skiwi::token>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,rd);
  tokenize((vector<skiwi::token,_std::allocator<skiwi::token>_> *)local_148,input);
  local_150._M_current =
       (token *)std::vector<skiwi::token,_std::allocator<skiwi::token>_>::begin
                          ((vector<skiwi::token,_std::allocator<skiwi::token>_> *)local_148);
  local_158 = (token *)std::vector<skiwi::token,_std::allocator<skiwi::token>_>::end
                                 ((vector<skiwi::token,_std::allocator<skiwi::token>_> *)local_148);
  std::
  reverse<__gnu_cxx::__normal_iterator<skiwi::token*,std::vector<skiwi::token,std::allocator<skiwi::token>>>>
            (local_150,
             (__normal_iterator<skiwi::token_*,_std::vector<skiwi::token,_std::allocator<skiwi::token>_>_>
              )local_158);
  make_program(&local_1b8,(vector<skiwi::token,_std::allocator<skiwi::token>_> *)local_148);
  Program::operator=((Program *)local_c0,&local_1b8);
  Program::~Program(&local_1b8);
  std::vector<skiwi::token,_std::allocator<skiwi::token>_>::~vector
            ((vector<skiwi::token,_std::allocator<skiwi::token>_> *)local_148);
  skiwi::compile(env,rd,(macro_data *)((anonymous_namespace)::cd + 0x1d8),
                 (context *)((anonymous_namespace)::cd + 0x30),
                 (asmcode *)&prog.quasiquotes_converted,(Program *)local_c0,
                 (primitive_map *)((anonymous_namespace)::cd + 0x248),
                 (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_skiwi::external_function,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_skiwi::external_function>_>_>
                  *)((anonymous_namespace)::cd + 0x278),
                 (compiler_options *)((anonymous_namespace)::cd + 4));
  assembler::first_pass_data::first_pass_data((first_pass_data *)&f);
  p_Var1 = (fptr)assembler::assemble(size,(first_pass_data *)&f,
                                     (asmcode *)&prog.quasiquotes_converted);
  d.external_to_address._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ = 1;
  assembler::first_pass_data::~first_pass_data((first_pass_data *)&f);
  repl_data::~repl_data
            ((repl_data *)
             &tokens.super__Vector_base<skiwi::token,_std::allocator<skiwi::token>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::shared_ptr<skiwi::environment<skiwi::environment_entry>_>::~shared_ptr
            ((shared_ptr<skiwi::environment<skiwi::environment_entry>_> *)&rd_copy.global_index);
  Program::~Program((Program *)local_c0);
  assembler::asmcode::~asmcode((asmcode *)&prog.quasiquotes_converted);
  return p_Var1;
}

Assistant:

compiler_data::fptr compile(uint64_t& size, const std::string& input, environment_map& env, repl_data& rd)
    {
    using namespace SKIWI;

    asmcode code;
    Program prog;
    auto env_copy = make_deep_copy(env);
    auto rd_copy = make_deep_copy(rd);
    try
      {
      auto tokens = tokenize(input);
      std::reverse(tokens.begin(), tokens.end());
      prog = make_program(tokens);
      }
    catch (std::logic_error e)
      {
      env = env_copy;
      rd = rd_copy;
      code.clear();
      err(e.what(), "\n");
      return nullptr;
      }
    try
      {
      compile(env, rd, cd.md, cd.ctxt, code, prog, cd.pm, cd.externals, cd.ops);
      first_pass_data d;
      compiler_data::fptr f = (compiler_data::fptr)assemble(size, d, code);
      return f;
      }
    catch (std::logic_error e)
      {
      env = env_copy;
      rd = rd_copy;
      code.clear();
      err(e.what(), "\n");
      }
    catch (std::runtime_error e)
      {
      env = env_copy;
      rd = rd_copy;
      code.clear();
      err(e.what(), "\n");
      }
    return nullptr;
    }